

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# structurally_valid.cc
# Opt level: O2

char * __thiscall
google::protobuf::internal::UTF8CoerceToStructurallyValid
          (internal *this,StringPiece src_str,char *idst,char replace_char)

{
  int iVar1;
  internal *__dest;
  stringpiece_ssize_type extraout_RDX;
  stringpiece_ssize_type sVar2;
  stringpiece_ssize_type extraout_RDX_00;
  internal *piVar3;
  internal *piVar4;
  size_t sVar5;
  internal *piVar6;
  StringPiece str;
  
  __dest = (internal *)src_str.length_;
  iVar1 = UTF8SpnStructurallyValid(this,src_str);
  piVar4 = this;
  if (iVar1 != (int)src_str.ptr_) {
    sVar5 = (size_t)iVar1;
    memmove(__dest,this,sVar5);
    piVar6 = __dest + sVar5;
    sVar2 = extraout_RDX;
    for (piVar3 = this + sVar5; piVar4 = __dest, piVar3 < this + (int)src_str.ptr_;
        piVar3 = piVar3 + sVar5 + 1) {
      *piVar6 = SUB81(idst,0);
      piVar4 = piVar3 + 1;
      str.ptr_ = this + (int)src_str.ptr_ + -(long)piVar4;
      str.length_ = sVar2;
      iVar1 = UTF8SpnStructurallyValid(piVar4,str);
      sVar5 = (size_t)iVar1;
      memmove(piVar6 + 1,piVar4,sVar5);
      piVar6 = piVar6 + sVar5 + 1;
      sVar2 = extraout_RDX_00;
    }
  }
  return (char *)piVar4;
}

Assistant:

char* UTF8CoerceToStructurallyValid(StringPiece src_str, char* idst,
                                    const char replace_char) {
  const char* isrc = src_str.data();
  const int len = src_str.length();
  int n = UTF8SpnStructurallyValid(src_str);
  if (n == len) {               // Normal case -- all is cool, return
    return const_cast<char*>(isrc);
  } else {                      // Unusual case -- copy w/o bad bytes
    const char* src = isrc;
    const char* srclimit = isrc + len;
    char* dst = idst;
    memmove(dst, src, n);       // Copy initial good chunk
    src += n;
    dst += n;
    while (src < srclimit) {    // src points to bogus byte or is off the end
      dst[0] = replace_char;                    // replace one bad byte
      src++;
      dst++;
      StringPiece str2(src, srclimit - src);
      n = UTF8SpnStructurallyValid(str2);       // scan the remainder
      memmove(dst, src, n);                     // copy next good chunk
      src += n;
      dst += n;
    }
  }
  return idst;
}